

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O0

void cft1st(size_t n,float *a,float *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  size_t sVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float x3i;
  float x3r;
  float x2i;
  float x2r;
  float x1i;
  float x1r;
  float x0i;
  float x0r;
  float wk3i;
  float wk3r;
  float wk2i;
  float wk2r;
  float wk1i;
  float wk1r;
  size_t k2;
  size_t k1;
  size_t j;
  float *w_local;
  float *a_local;
  size_t n_local;
  
  fVar15 = *a;
  fVar8 = a[1];
  fVar9 = *a;
  fVar14 = a[2];
  fVar12 = a[1];
  fVar13 = a[3];
  fVar1 = a[4];
  fVar2 = a[6];
  fVar3 = a[5];
  *a = fVar15 + a[2] + a[4] + a[6];
  a[1] = fVar8 + a[3] + a[5] + a[7];
  a[4] = (fVar15 + a[2]) - (a[4] + a[6]);
  a[5] = (fVar8 + a[3]) - (a[5] + a[7]);
  a[2] = (fVar9 - fVar14) - (fVar3 - a[7]);
  a[3] = (fVar12 - fVar13) + (fVar1 - fVar2);
  a[6] = (fVar9 - fVar14) + (fVar3 - a[7]);
  a[7] = (fVar12 - fVar13) - (fVar1 - fVar2);
  fVar15 = w[2];
  fVar8 = a[8];
  fVar9 = a[9];
  fVar14 = a[8];
  fVar12 = a[10];
  fVar13 = a[9];
  fVar1 = a[0xb];
  fVar2 = a[0xc];
  fVar3 = a[0xc];
  fVar4 = a[0xd];
  a[8] = fVar8 + a[10] + fVar2 + a[0xe];
  a[9] = fVar9 + a[0xb] + a[0xd] + a[0xf];
  a[0xc] = (a[0xd] + a[0xf]) - (fVar9 + a[0xb]);
  a[0xd] = (fVar8 + a[10]) - (fVar2 + a[0xe]);
  fVar8 = (fVar14 - fVar12) - (fVar4 - a[0xf]);
  fVar9 = (fVar13 - fVar1) + (fVar3 - a[0xe]);
  a[10] = fVar15 * (fVar8 - fVar9);
  a[0xb] = fVar15 * (fVar8 + fVar9);
  fVar8 = (fVar4 - a[0xf]) + (fVar14 - fVar12);
  fVar9 = (fVar3 - a[0xe]) - (fVar13 - fVar1);
  a[0xe] = fVar15 * (fVar9 - fVar8);
  a[0xf] = fVar15 * (fVar9 + fVar8);
  k2 = 0;
  for (k1 = 0x10; k1 < n; k1 = k1 + 0x10) {
    sVar7 = k2 + 2;
    fVar15 = w[sVar7];
    fVar8 = w[k2 + 3];
    fVar9 = w[sVar7 * 2];
    fVar14 = w[sVar7 * 2 + 1];
    fVar10 = -(fVar8 * 2.0) * fVar14 + fVar9;
    fVar11 = fVar8 * 2.0 * fVar9 + -fVar14;
    fVar12 = a[k1];
    fVar13 = a[k1 + 1];
    fVar1 = a[k1];
    fVar2 = a[k1 + 2];
    fVar3 = a[k1 + 1];
    fVar4 = a[k1 + 3];
    fVar5 = a[k1 + 4];
    fVar6 = a[k1 + 5];
    a[k1] = fVar12 + a[k1 + 2] + a[k1 + 4] + a[k1 + 6];
    a[k1 + 1] = fVar13 + a[k1 + 3] + a[k1 + 5] + a[k1 + 7];
    fVar12 = (fVar12 + a[k1 + 2]) - (a[k1 + 4] + a[k1 + 6]);
    fVar13 = (fVar13 + a[k1 + 3]) - (a[k1 + 5] + a[k1 + 7]);
    a[k1 + 4] = fVar15 * fVar12 + -(fVar8 * fVar13);
    a[k1 + 5] = fVar15 * fVar13 + fVar8 * fVar12;
    fVar12 = (fVar1 - fVar2) - (fVar6 - a[k1 + 7]);
    fVar13 = (fVar3 - fVar4) + (fVar5 - a[k1 + 6]);
    a[k1 + 2] = fVar9 * fVar12 + -(fVar14 * fVar13);
    a[k1 + 3] = fVar9 * fVar13 + fVar14 * fVar12;
    fVar9 = (fVar1 - fVar2) + (fVar6 - a[k1 + 7]);
    fVar14 = (fVar3 - fVar4) - (fVar5 - a[k1 + 6]);
    a[k1 + 6] = fVar10 * fVar9 + -(fVar11 * fVar14);
    a[k1 + 7] = fVar10 * fVar14 + fVar11 * fVar9;
    fVar9 = w[sVar7 * 2 + 2];
    fVar14 = w[sVar7 * 2 + 3];
    fVar10 = -(fVar15 * 2.0) * fVar14 + fVar9;
    fVar11 = fVar15 * 2.0 * fVar9 + -fVar14;
    fVar12 = a[k1 + 8];
    fVar13 = a[k1 + 9];
    fVar1 = a[k1 + 8];
    fVar2 = a[k1 + 10];
    fVar3 = a[k1 + 9];
    fVar4 = a[k1 + 0xb];
    fVar5 = a[k1 + 0xc];
    fVar6 = a[k1 + 0xd];
    a[k1 + 8] = fVar12 + a[k1 + 10] + a[k1 + 0xc] + a[k1 + 0xe];
    a[k1 + 9] = fVar13 + a[k1 + 0xb] + a[k1 + 0xd] + a[k1 + 0xf];
    fVar12 = (fVar12 + a[k1 + 10]) - (a[k1 + 0xc] + a[k1 + 0xe]);
    fVar13 = (fVar13 + a[k1 + 0xb]) - (a[k1 + 0xd] + a[k1 + 0xf]);
    a[k1 + 0xc] = -fVar8 * fVar12 + -(fVar15 * fVar13);
    a[k1 + 0xd] = -fVar8 * fVar13 + fVar15 * fVar12;
    fVar15 = (fVar1 - fVar2) - (fVar6 - a[k1 + 0xf]);
    fVar8 = (fVar3 - fVar4) + (fVar5 - a[k1 + 0xe]);
    a[k1 + 10] = fVar9 * fVar15 + -(fVar14 * fVar8);
    a[k1 + 0xb] = fVar9 * fVar8 + fVar14 * fVar15;
    fVar15 = (fVar1 - fVar2) + (fVar6 - a[k1 + 0xf]);
    fVar8 = (fVar3 - fVar4) - (fVar5 - a[k1 + 0xe]);
    a[k1 + 0xe] = fVar10 * fVar15 + -(fVar11 * fVar8);
    a[k1 + 0xf] = fVar10 * fVar8 + fVar11 * fVar15;
    k2 = sVar7;
  }
  return;
}

Assistant:

static void cft1st(size_t n, float *a, float *w)
{
    size_t j, k1, k2;
    float wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
    float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    x0r = a[0] + a[2];
    x0i = a[1] + a[3];
    x1r = a[0] - a[2];
    x1i = a[1] - a[3];
    x2r = a[4] + a[6];
    x2i = a[5] + a[7];
    x3r = a[4] - a[6];
    x3i = a[5] - a[7];
    a[0] = x0r + x2r;
    a[1] = x0i + x2i;
    a[4] = x0r - x2r;
    a[5] = x0i - x2i;
    a[2] = x1r - x3i;
    a[3] = x1i + x3r;
    a[6] = x1r + x3i;
    a[7] = x1i - x3r;
    wk1r = w[2];
    x0r = a[8] + a[10];
    x0i = a[9] + a[11];
    x1r = a[8] - a[10];
    x1i = a[9] - a[11];
    x2r = a[12] + a[14];
    x2i = a[13] + a[15];
    x3r = a[12] - a[14];
    x3i = a[13] - a[15];
    a[8] = x0r + x2r;
    a[9] = x0i + x2i;
    a[12] = x2i - x0i;
    a[13] = x0r - x2r;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[10] = wk1r * (x0r - x0i);
    a[11] = wk1r * (x0r + x0i);
    x0r = x3i + x1r;
    x0i = x3r - x1i;
    a[14] = wk1r * (x0i - x0r);
    a[15] = wk1r * (x0i + x0r);
    k1 = 0;
    for (j = 16; j < n; j += 16) {
        k1 += 2;
        k2 = 2 * k1;
        wk2r = w[k1];
        wk2i = w[k1 + 1];
        wk1r = w[k2];
        wk1i = w[k2 + 1];
        wk3r = wk1r - 2 * wk2i * wk1i;
        wk3i = 2 * wk2i * wk1r - wk1i;
        x0r = a[j] + a[j + 2];
        x0i = a[j + 1] + a[j + 3];
        x1r = a[j] - a[j + 2];
        x1i = a[j + 1] - a[j + 3];
        x2r = a[j + 4] + a[j + 6];
        x2i = a[j + 5] + a[j + 7];
        x3r = a[j + 4] - a[j + 6];
        x3i = a[j + 5] - a[j + 7];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        x0r -= x2r;
        x0i -= x2i;
        a[j + 4] = wk2r * x0r - wk2i * x0i;
        a[j + 5] = wk2r * x0i + wk2i * x0r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j + 2] = wk1r * x0r - wk1i * x0i;
        a[j + 3] = wk1r * x0i + wk1i * x0r;
        x0r = x1r + x3i;
        x0i = x1i - x3r;
        a[j + 6] = wk3r * x0r - wk3i * x0i;
        a[j + 7] = wk3r * x0i + wk3i * x0r;
        wk1r = w[k2 + 2];
        wk1i = w[k2 + 3];
        wk3r = wk1r - 2 * wk2r * wk1i;
        wk3i = 2 * wk2r * wk1r - wk1i;
        x0r = a[j + 8] + a[j + 10];
        x0i = a[j + 9] + a[j + 11];
        x1r = a[j + 8] - a[j + 10];
        x1i = a[j + 9] - a[j + 11];
        x2r = a[j + 12] + a[j + 14];
        x2i = a[j + 13] + a[j + 15];
        x3r = a[j + 12] - a[j + 14];
        x3i = a[j + 13] - a[j + 15];
        a[j + 8] = x0r + x2r;
        a[j + 9] = x0i + x2i;
        x0r -= x2r;
        x0i -= x2i;
        a[j + 12] = -wk2i * x0r - wk2r * x0i;
        a[j + 13] = -wk2i * x0i + wk2r * x0r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j + 10] = wk1r * x0r - wk1i * x0i;
        a[j + 11] = wk1r * x0i + wk1i * x0r;
        x0r = x1r + x3i;
        x0i = x1i - x3r;
        a[j + 14] = wk3r * x0r - wk3i * x0i;
        a[j + 15] = wk3r * x0i + wk3i * x0r;
    }
}